

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O0

MPP_RET mpp_opt_add(MppOpt opt,MppOptInfo *info)

{
  MppOptImpl *impl;
  MppOptInfo *info_local;
  MppOpt opt_local;
  
  if ((opt == (MppOpt)0x0) || (*(long *)((long)opt + 8) == 0)) {
    opt_local._4_4_ = MPP_NOK;
  }
  else if (info == (MppOptInfo *)0x0) {
    opt_local._4_4_ = mpp_trie_add_info(*(undefined8 *)((long)opt + 8),0,0,0);
  }
  else {
    opt_local._4_4_ = mpp_trie_add_info(*(undefined8 *)((long)opt + 8),info->name,info,0x20);
  }
  return opt_local._4_4_;
}

Assistant:

MPP_RET mpp_opt_add(MppOpt opt, MppOptInfo *info)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl || NULL == impl->trie)
        return MPP_NOK;

    if (NULL == info)
        return mpp_trie_add_info(impl->trie, NULL, NULL, 0);

    return mpp_trie_add_info(impl->trie, info->name, info, sizeof(*info));
}